

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

char * old_create_multityped_action_spec
                 (CMFormatList *input_format_lists,CMFormatList out_format_list,char *function)

{
  long *plVar1;
  undefined8 *puVar2;
  FMFieldList p_Var3;
  int iVar4;
  FMStructDescList *input_format_lists_00;
  CMFormatList pCVar5;
  FMStructDescList p_Var6;
  long lVar7;
  CMFormatList pCVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  CMFormatList pCVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  lVar11 = 1;
  uVar14 = 0;
  do {
    lVar11 = lVar11 + -1;
    plVar1 = (long *)((long)input_format_lists + uVar14);
    uVar14 = uVar14 + 8;
  } while (*plVar1 != 0);
  pCVar12 = out_format_list;
  input_format_lists_00 = (FMStructDescList *)INT_CMmalloc(uVar14 & 0x7fffffff8);
  for (lVar7 = 0; -lVar7 != lVar11; lVar7 = lVar7 + 1) {
    uVar14 = 0x20;
    lVar13 = 0;
    pCVar8 = input_format_lists[lVar7];
    for (pCVar5 = pCVar8; (pCVar8 != (CMFormatList)0x0 && (pCVar5->format_name != (char *)0x0));
        pCVar5 = pCVar5 + 1) {
      lVar13 = lVar13 + 1;
      uVar14 = uVar14 + 0x20;
    }
    p_Var6 = (FMStructDescList)INT_CMmalloc(uVar14 & 0x1fffffffe0);
    lVar15 = 8;
    while (bVar16 = lVar13 != 0, lVar13 = lVar13 + -1, bVar16) {
      *(undefined8 *)((long)p_Var6 + lVar15 * 2 + -0x10) =
           *(undefined8 *)((long)pCVar8 + lVar15 + -8);
      p_Var3 = *(FMFieldList *)((long)&pCVar8->format_name + lVar15);
      *(FMFieldList *)((long)p_Var6 + lVar15 * 2 + -8) = p_Var3;
      iVar4 = struct_size_field_list(p_Var3,(int)pCVar12);
      *(int *)((long)&p_Var6->format_name + lVar15 * 2) = iVar4;
      *(undefined8 *)((long)&p_Var6->field_list + lVar15 * 2) = 0;
      lVar15 = lVar15 + 0x10;
    }
    puVar2 = (undefined8 *)((long)&p_Var6[-1].format_name + uVar14);
    *puVar2 = 0;
    puVar2[1] = 0;
    input_format_lists_00[lVar7] = p_Var6;
  }
  uVar14 = 0x20;
  lVar11 = 0;
  for (pCVar8 = out_format_list;
      (out_format_list != (CMFormatList)0x0 && (pCVar8->format_name != (char *)0x0));
      pCVar8 = pCVar8 + 1) {
    lVar11 = lVar11 + 1;
    uVar14 = uVar14 + 0x20;
  }
  pvVar9 = INT_CMmalloc(uVar14 & 0x1fffffffe0);
  lVar7 = 8;
  while (bVar16 = lVar11 != 0, lVar11 = lVar11 + -1, bVar16) {
    *(undefined8 *)((long)pvVar9 + lVar7 * 2 + -0x10) =
         *(undefined8 *)((long)out_format_list + lVar7 + -8);
    p_Var3 = *(FMFieldList *)((long)&out_format_list->format_name + lVar7);
    *(FMFieldList *)((long)pvVar9 + lVar7 * 2 + -8) = p_Var3;
    iVar4 = struct_size_field_list(p_Var3,(int)pCVar12);
    *(int *)((long)pvVar9 + lVar7 * 2) = iVar4;
    *(undefined8 *)((long)pvVar9 + lVar7 * 2 + 8) = 0;
    lVar7 = lVar7 + 0x10;
  }
  puVar2 = (undefined8 *)((long)pvVar9 + (uVar14 - 0x20));
  *puVar2 = 0;
  puVar2[1] = 0;
  pcVar10 = create_multityped_action_spec(input_format_lists_00,function);
  return pcVar10;
}

Assistant:

extern char*
old_create_multityped_action_spec(CMFormatList *input_format_lists, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs, *struct_list;
    int struct_count = 0, j;
    int count, i;
    while (input_format_lists[struct_count] != NULL) struct_count++;
    struct_list = malloc(sizeof(struct_list[0]) * (struct_count+1));
    for (j = 0; j < struct_count ; j++) {
	CMFormatList format_list = input_format_lists[j];
	count = 0;
	while (format_list && (format_list[count].format_name != NULL)) count++;
	structs = malloc(sizeof(structs[0]) * (count + 1));
	for (i = 0; i < count; i++) {
	    structs[i].format_name = format_list[i].format_name;
	    structs[i].field_list = format_list[i].field_list;
	    structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	    structs[i].opt_info = NULL;
	}
	structs[count].format_name = NULL;
	structs[count].field_list = NULL;
	struct_list[j] = structs;
    }

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_multityped_action_spec(struct_list, function);
}